

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::DescriptorDatabaseTest_FindFileByName_Test::TestBody
          (DescriptorDatabaseTest_FindFileByName_Test *this)

{
  DescriptorDatabase *pDVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  string *psVar5;
  char *in_R9;
  string local_4e8;
  AssertHelper local_4c8;
  Message local_4c0;
  allocator<char> local_4b1;
  string local_4b0 [39];
  bool local_489;
  undefined1 local_488 [8];
  AssertionResult gtest_ar__2;
  FileDescriptorProto file_2;
  string local_378;
  AssertHelper local_358;
  Message local_350;
  undefined1 local_348 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_318;
  Message local_310;
  allocator<char> local_301;
  string local_300 [39];
  bool local_2d9;
  undefined1 local_2d8 [8];
  AssertionResult gtest_ar__1;
  FileDescriptorProto file_1;
  string local_1c8;
  AssertHelper local_1a8;
  Message local_1a0;
  undefined1 local_198 [8];
  AssertionResult gtest_ar;
  AssertHelper local_168;
  Message local_160 [3];
  allocator<char> local_141;
  string local_140 [39];
  bool local_119;
  undefined1 local_118 [8];
  AssertionResult gtest_ar_;
  FileDescriptorProto file;
  DescriptorDatabaseTest_FindFileByName_Test *this_local;
  
  DescriptorDatabaseTest::AddToDatabase
            (&this->super_DescriptorDatabaseTest,"name: \"foo.proto\" message_type { name:\"Foo\" }"
            );
  DescriptorDatabaseTest::AddToDatabase
            (&this->super_DescriptorDatabaseTest,"name: \"bar.proto\" message_type { name:\"Bar\" }"
            );
  FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)&gtest_ar_.message_);
  pDVar1 = (this->super_DescriptorDatabaseTest).database_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_140,"foo.proto",&local_141);
  iVar3 = (*pDVar1->_vptr_DescriptorDatabase[2])(pDVar1,local_140,&gtest_ar_.message_);
  local_119 = (bool)((byte)iVar3 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_118,&local_119,(type *)0x0);
  std::__cxx11::string::~string(local_140);
  std::allocator<char>::~allocator(&local_141);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_118);
  if (!bVar2) {
    testing::Message::Message(local_160);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar.message_,(internal *)local_118,
               (AssertionResult *)"database_->FindFileByName(\"foo.proto\", &file)","false","true",
               in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database_unittest.cc"
               ,0xa1,pcVar4);
    testing::internal::AssertHelper::operator=(&local_168,local_160);
    testing::internal::AssertHelper::~AssertHelper(&local_168);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(local_160);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_118);
  psVar5 = FileDescriptorProto::name_abi_cxx11_((FileDescriptorProto *)&gtest_ar_.message_);
  testing::internal::EqHelper::
  Compare<char[10],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_198,"\"foo.proto\"","file.name()",(char (*) [10])0x1e1d402,psVar5);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_198);
  if (!bVar2) {
    testing::Message::Message(&local_1a0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_198);
    testing::internal::AssertHelper::AssertHelper
              (&local_1a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database_unittest.cc"
               ,0xa2,pcVar4);
    testing::internal::AssertHelper::operator=(&local_1a8,&local_1a0);
    testing::internal::AssertHelper::~AssertHelper(&local_1a8);
    testing::Message::~Message(&local_1a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_198);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c8,"Foo",(allocator<char> *)((long)&file_1.field_0 + 0xe7));
  ExpectContainsType((FileDescriptorProto *)&gtest_ar_.message_,&local_1c8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&file_1.field_0 + 0xe7));
  FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)&gtest_ar_.message_);
  FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)&gtest_ar__1.message_);
  pDVar1 = (this->super_DescriptorDatabaseTest).database_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_300,"bar.proto",&local_301);
  iVar3 = (*pDVar1->_vptr_DescriptorDatabase[2])(pDVar1,local_300,&gtest_ar__1.message_);
  local_2d9 = (bool)((byte)iVar3 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_2d8,&local_2d9,(type *)0x0);
  std::__cxx11::string::~string(local_300);
  std::allocator<char>::~allocator(&local_301);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2d8);
  if (!bVar2) {
    testing::Message::Message(&local_310);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_1.message_,(internal *)local_2d8,
               (AssertionResult *)"database_->FindFileByName(\"bar.proto\", &file)","false","true",
               in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_318,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database_unittest.cc"
               ,0xa8,pcVar4);
    testing::internal::AssertHelper::operator=(&local_318,&local_310);
    testing::internal::AssertHelper::~AssertHelper(&local_318);
    std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_310);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2d8);
  psVar5 = FileDescriptorProto::name_abi_cxx11_((FileDescriptorProto *)&gtest_ar__1.message_);
  testing::internal::EqHelper::
  Compare<char[10],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_348,"\"bar.proto\"","file.name()",(char (*) [10])0x1e1d7ee,psVar5);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_348);
  if (!bVar2) {
    testing::Message::Message(&local_350);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_348);
    testing::internal::AssertHelper::AssertHelper
              (&local_358,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database_unittest.cc"
               ,0xa9,pcVar4);
    testing::internal::AssertHelper::operator=(&local_358,&local_350);
    testing::internal::AssertHelper::~AssertHelper(&local_358);
    testing::Message::~Message(&local_350);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_348);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_378,"Bar",(allocator<char> *)((long)&file_2.field_0 + 0xe7));
  ExpectContainsType((FileDescriptorProto *)&gtest_ar__1.message_,&local_378);
  std::__cxx11::string::~string((string *)&local_378);
  std::allocator<char>::~allocator((allocator<char> *)((long)&file_2.field_0 + 0xe7));
  FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)&gtest_ar__1.message_);
  FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)&gtest_ar__2.message_);
  pDVar1 = (this->super_DescriptorDatabaseTest).database_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_4b0,"baz.proto",&local_4b1);
  iVar3 = (*pDVar1->_vptr_DescriptorDatabase[2])(pDVar1,local_4b0,&gtest_ar__2.message_);
  local_489 = (bool)(~(byte)iVar3 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_488,&local_489,(type *)0x0);
  std::__cxx11::string::~string(local_4b0);
  std::allocator<char>::~allocator(&local_4b1);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_488);
  if (!bVar2) {
    testing::Message::Message(&local_4c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_4e8,(internal *)local_488,
               (AssertionResult *)"database_->FindFileByName(\"baz.proto\", &file)","true","false",
               in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_4c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database_unittest.cc"
               ,0xb0,pcVar4);
    testing::internal::AssertHelper::operator=(&local_4c8,&local_4c0);
    testing::internal::AssertHelper::~AssertHelper(&local_4c8);
    std::__cxx11::string::~string((string *)&local_4e8);
    testing::Message::~Message(&local_4c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_488);
  FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)&gtest_ar__2.message_);
  return;
}

Assistant:

TEST_P(DescriptorDatabaseTest, FindFileByName) {
  AddToDatabase(
      "name: \"foo.proto\" "
      "message_type { name:\"Foo\" }");
  AddToDatabase(
      "name: \"bar.proto\" "
      "message_type { name:\"Bar\" }");

  {
    FileDescriptorProto file;
    EXPECT_TRUE(database_->FindFileByName("foo.proto", &file));
    EXPECT_EQ("foo.proto", file.name());
    ExpectContainsType(file, "Foo");
  }

  {
    FileDescriptorProto file;
    EXPECT_TRUE(database_->FindFileByName("bar.proto", &file));
    EXPECT_EQ("bar.proto", file.name());
    ExpectContainsType(file, "Bar");
  }

  {
    // Fails to find undefined files.
    FileDescriptorProto file;
    EXPECT_FALSE(database_->FindFileByName("baz.proto", &file));
  }
}